

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O1

SpectrumBilerpTexture *
pbrt::SpectrumBilerpTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,
          SpectrumType spectrumType,FileLoc *loc,Allocator alloc)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SpectrumBilerpTexture *pSVar2;
  Allocator alloc_00;
  Allocator alloc_01;
  Allocator alloc_02;
  Allocator alloc_03;
  uintptr_t iptr;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  TextureMapping2DHandle map;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  local_f8 [2];
  long local_e8 [2];
  undefined1 local_d8 [16];
  undefined1 local_c8 [8];
  NamedTextures *local_c0;
  undefined1 local_b0 [24];
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  local_98;
  SpectrumHandle local_90 [2];
  long local_80 [2];
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  local_70 [2];
  _Base_ptr local_60 [2];
  _Base_ptr local_50;
  _Base_ptr local_48;
  _Base_ptr local_40;
  _Base_ptr local_38;
  undefined4 extraout_var_01;
  
  TextureMapping2DHandle::Create
            ((TextureMapping2DHandle *)&local_98,parameters->dict,renderFromTexture,loc,alloc);
  iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4,4);
  *(undefined4 *)CONCAT44(extraout_var,iVar1) = 0;
  p_Var3 = (_Base_ptr)(CONCAT44(extraout_var,iVar1) | 0x1000000000000);
  iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4,4);
  *(undefined4 *)CONCAT44(extraout_var_00,iVar1) = 0x3f800000;
  local_c0 = (NamedTextures *)local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"v00","");
  alloc_00.memoryResource._4_4_ = 0;
  alloc_00.memoryResource._0_4_ = spectrumType;
  local_38 = p_Var3;
  TextureParameterDictionary::GetOneSpectrum
            ((TextureParameterDictionary *)(local_b0 + 0x10),(string *)parameters,
             (SpectrumHandle *)&local_c0,(SpectrumType)&local_38,alloc_00);
  local_f8[0].bits = (uintptr_t)local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"v01","");
  p_Var4 = (_Base_ptr)(CONCAT44(extraout_var_00,iVar1) | 0x1000000000000);
  alloc_01.memoryResource._4_4_ = 0;
  alloc_01.memoryResource._0_4_ = spectrumType;
  local_40 = p_Var4;
  TextureParameterDictionary::GetOneSpectrum
            ((TextureParameterDictionary *)local_c8,(string *)parameters,(SpectrumHandle *)local_f8,
             (SpectrumType)&local_40,alloc_01);
  local_70[0].bits = (uintptr_t)local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"v10","");
  alloc_02.memoryResource._4_4_ = 0;
  alloc_02.memoryResource._0_4_ = spectrumType;
  local_48 = p_Var3;
  TextureParameterDictionary::GetOneSpectrum
            ((TextureParameterDictionary *)(local_d8 + 8),(string *)parameters,
             (SpectrumHandle *)local_70,(SpectrumType)&local_48,alloc_02);
  local_90[0].
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
           )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
             )local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"v11","");
  alloc_03.memoryResource._4_4_ = 0;
  alloc_03.memoryResource._0_4_ = spectrumType;
  local_50 = p_Var4;
  TextureParameterDictionary::GetOneSpectrum
            ((TextureParameterDictionary *)local_d8,(string *)parameters,local_90,
             (SpectrumType)&local_50,alloc_03);
  iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x28,8);
  pSVar2 = (SpectrumBilerpTexture *)CONCAT44(extraout_var_01,iVar1);
  (pSVar2->mapping).
  super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  .bits = local_98.bits;
  (pSVar2->v00).
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  .bits = local_b0._16_8_;
  (pSVar2->v01).
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (uintptr_t)local_c8;
  (pSVar2->v10).
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  .bits = local_d8._8_8_;
  (pSVar2->v11).
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  .bits = local_d8._0_8_;
  if (local_90[0].
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
      .bits != (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
                )local_80) {
    operator_delete((void *)local_90[0].
                            super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
                            .bits,local_80[0] + 1);
  }
  if ((_Base_ptr *)local_70[0].bits != local_60) {
    operator_delete((void *)local_70[0].bits,(ulong)((long)&local_60[0]->_M_color + 1));
  }
  if ((long *)local_f8[0].bits != local_e8) {
    operator_delete((void *)local_f8[0].bits,local_e8[0] + 1);
  }
  if (local_c0 != (NamedTextures *)local_b0) {
    operator_delete(local_c0,local_b0._0_8_ + 1);
  }
  return pSVar2;
}

Assistant:

SpectrumBilerpTexture *SpectrumBilerpTexture::Create(
    const Transform &renderFromTexture, const TextureParameterDictionary &parameters,
    SpectrumType spectrumType, const FileLoc *loc, Allocator alloc) {
    // Initialize 2D texture mapping _map_ from _tp_
    TextureMapping2DHandle map =
        TextureMapping2DHandle::Create(parameters, renderFromTexture, loc, alloc);

    SpectrumHandle zero = alloc.new_object<ConstantSpectrum>(0.);
    SpectrumHandle one = alloc.new_object<ConstantSpectrum>(1.);

    return alloc.new_object<SpectrumBilerpTexture>(
        map, parameters.GetOneSpectrum("v00", zero, spectrumType, alloc),
        parameters.GetOneSpectrum("v01", one, spectrumType, alloc),
        parameters.GetOneSpectrum("v10", zero, spectrumType, alloc),
        parameters.GetOneSpectrum("v11", one, spectrumType, alloc));
}